

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.c
# Opt level: O2

int xmlPatternMatch(xmlPatternPtr comp,xmlNodePtr node)

{
  xmlPatOp xVar1;
  xmlStepOpPtr pxVar2;
  _xmlNode *p_Var3;
  int iVar4;
  uint uVar5;
  void *pvVar6;
  int iVar7;
  uint uVar8;
  xmlStepOpPtr pxVar9;
  ulong uVar10;
  xmlChar *str2;
  xmlChar *pxVar11;
  void *pvVar12;
  int iVar13;
  ulong uVar14;
  xmlNodePtr pxVar15;
  _xmlNode **pp_Var16;
  ulong local_40;
  
  iVar7 = -1;
  if (node != (xmlNodePtr)0x0 && comp != (xmlPatternPtr)0x0) {
    for (; comp != (xmlPatternPtr)0x0; comp = comp->next) {
      uVar14 = 0;
      local_40 = 0;
      pvVar12 = (void *)0x0;
      iVar7 = 0;
      pxVar15 = node;
LAB_0016b318:
      if (comp->nbStep <= iVar7) {
switchD_0016b34b_caseD_0:
        if (pvVar12 == (void *)0x0) {
          return 1;
        }
        (*xmlFree)(pvVar12);
        return 1;
      }
      pxVar2 = comp->steps;
      if (XML_OP_ALL < pxVar2[iVar7].op) {
LAB_0016b6a1:
        iVar7 = iVar7 + 1;
        goto LAB_0016b318;
      }
      pxVar9 = pxVar2 + iVar7;
      iVar13 = (int)uVar14;
      switch(pxVar2[iVar7].op) {
      case XML_OP_END:
        goto switchD_0016b34b_caseD_0;
      case XML_OP_ROOT:
        if ((pxVar15->type != XML_NAMESPACE_DECL) &&
           (pxVar15 = pxVar15->parent,
           (pxVar15->type | XML_CDATA_SECTION_NODE) == XML_HTML_DOCUMENT_NODE)) goto LAB_0016b6a1;
        break;
      case XML_OP_ELEM:
        if (pxVar15->type == XML_ELEMENT_NODE) {
LAB_0016b471:
          pxVar11 = pxVar9->value;
          if (pxVar11 != (xmlChar *)0x0) {
            if ((*pxVar11 != *pxVar15->name) ||
               (iVar4 = xmlStrEqual(pxVar11,pxVar15->name), iVar4 == 0)) break;
            if (pxVar15->ns == (xmlNs *)0x0) {
              if (pxVar9->value2 != (xmlChar *)0x0) break;
            }
            else {
              str2 = pxVar15->ns->href;
              if (str2 != (xmlChar *)0x0) {
                pxVar11 = pxVar9->value2;
                goto LAB_0016b4bc;
              }
            }
          }
          goto LAB_0016b6a1;
        }
        break;
      case XML_OP_CHILD:
        if (((pxVar15->type < XML_DTD_NODE) &&
            ((0x2202U >> (pxVar15->type & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0)) &&
           (pxVar9->value != (xmlChar *)0x0)) {
          pp_Var16 = &pxVar15->children;
          while (p_Var3 = *pp_Var16, p_Var3 != (_xmlNode *)0x0) {
            if (p_Var3->type == XML_ELEMENT_NODE) {
              if ((*pxVar9->value == *p_Var3->name) &&
                 (iVar4 = xmlStrEqual(pxVar9->value,p_Var3->name), iVar4 != 0)) goto LAB_0016b6a1;
            }
            pp_Var16 = &p_Var3->next;
          }
        }
        break;
      case XML_OP_ATTR:
        if ((pxVar15->type == XML_ATTRIBUTE_NODE) &&
           ((pxVar11 = pxVar9->value, pxVar11 == (xmlChar *)0x0 ||
            ((*pxVar11 == *pxVar15->name && (iVar4 = xmlStrEqual(pxVar11,pxVar15->name), iVar4 != 0)
             ))))) {
          pxVar11 = pxVar9->value2;
          if (pxVar15->ns != (xmlNs *)0x0) {
            if (pxVar11 == (xmlChar *)0x0) goto LAB_0016b6a1;
            str2 = pxVar15->ns->href;
            goto LAB_0016b518;
          }
joined_r0x0016b534:
          if (pxVar11 == (xmlChar *)0x0) goto LAB_0016b6a1;
        }
        break;
      case XML_OP_PARENT:
        if (((XML_NAMESPACE_DECL < pxVar15->type) ||
            ((0x42200U >> (pxVar15->type & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0)) &&
           (pxVar15 = pxVar15->parent, pxVar15 != (xmlNodePtr)0x0)) goto LAB_0016b471;
        break;
      case XML_OP_ANCESTOR:
        if (pxVar9->value == (xmlChar *)0x0) {
          iVar7 = iVar7 + 1;
          if (pxVar2[iVar7].op != XML_OP_ELEM) {
            if (pxVar2[iVar7].op == XML_OP_ROOT) goto switchD_0016b34b_caseD_0;
            break;
          }
          pxVar9 = pxVar2 + iVar7;
          if (pxVar9->value == (xmlChar *)0x0) {
            return -1;
          }
        }
        if ((pxVar15 != (xmlNodePtr)0x0) &&
           ((XML_NAMESPACE_DECL < pxVar15->type ||
            ((0x42200U >> (pxVar15->type & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0)))) {
          do {
            while( true ) {
              do {
                do {
                  pxVar15 = pxVar15->parent;
                  if (pxVar15 == (xmlNodePtr)0x0) goto LAB_0016b605;
                } while (pxVar15->type != XML_ELEMENT_NODE);
              } while ((*pxVar9->value != *pxVar15->name) ||
                      (iVar4 = xmlStrEqual(pxVar9->value,pxVar15->name), iVar4 == 0));
              if (pxVar15->ns == (xmlNs *)0x0) break;
              pxVar11 = pxVar15->ns->href;
              if (((pxVar11 != (xmlChar *)0x0) && (pxVar9->value2 != (xmlChar *)0x0)) &&
                 (iVar4 = xmlStrEqual(pxVar9->value2,pxVar11), iVar4 != 0)) goto LAB_0016b5d2;
            }
          } while (pxVar9->value2 != (xmlChar *)0x0);
LAB_0016b5d2:
          xVar1 = pxVar9->op;
          uVar5 = (uint)local_40;
          pvVar6 = pvVar12;
          uVar10 = local_40;
          if ((int)uVar5 <= iVar13) {
            uVar10 = 4;
            if (0 < (int)uVar5) {
              if (999999999 < uVar5) goto LAB_0016b6a1;
              uVar8 = uVar5 + 1 >> 1;
              uVar10 = (ulong)(uVar8 + uVar5);
              if (1000000000 - uVar8 < uVar5) {
                uVar10 = 1000000000;
              }
            }
            pvVar6 = (*xmlRealloc)(pvVar12,uVar10 << 4);
            if (pvVar6 == (void *)0x0) goto LAB_0016b6a1;
          }
          *(uint *)((long)pvVar6 + (long)iVar13 * 0x10) = iVar7 - (uint)(xVar1 != XML_OP_ANCESTOR);
          uVar14 = (ulong)(iVar13 + 1);
          *(xmlNodePtr *)((long)pvVar6 + (long)iVar13 * 0x10 + 8) = pxVar15;
          pvVar12 = pvVar6;
          local_40 = uVar10;
          goto LAB_0016b6a1;
        }
        break;
      case XML_OP_NS:
        if (pxVar15->type == XML_ELEMENT_NODE) {
          if (pxVar15->ns == (xmlNs *)0x0) {
            pxVar11 = pxVar9->value;
            goto joined_r0x0016b534;
          }
          str2 = pxVar15->ns->href;
          if (str2 == (xmlChar *)0x0) goto LAB_0016b6a1;
          pxVar11 = pxVar9->value;
LAB_0016b4bc:
          if (pxVar11 != (xmlChar *)0x0) {
LAB_0016b518:
            iVar4 = xmlStrEqual(pxVar11,str2);
            if (iVar4 != 0) goto LAB_0016b6a1;
          }
        }
        break;
      case XML_OP_ALL:
        if (pxVar15->type == XML_ELEMENT_NODE) goto LAB_0016b6a1;
      }
LAB_0016b605:
      if (pvVar12 == (void *)0x0) goto LAB_0016b6b9;
      if (0 < iVar13) {
        uVar14 = (ulong)(iVar13 - 1);
        iVar7 = *(int *)((long)pvVar12 + uVar14 * 0x10);
        pxVar15 = *(xmlNodePtr *)((long)pvVar12 + uVar14 * 0x10 + 8);
        goto LAB_0016b318;
      }
      (*xmlFree)(pvVar12);
LAB_0016b6b9:
    }
    iVar7 = 0;
  }
  return iVar7;
}

Assistant:

int
xmlPatternMatch(xmlPatternPtr comp, xmlNodePtr node)
{
    int ret = 0;

    if ((comp == NULL) || (node == NULL))
        return(-1);

    while (comp != NULL) {
        ret = xmlPatMatch(comp, node);
	if (ret != 0)
	    return(ret);
	comp = comp->next;
    }
    return(ret);
}